

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::WriteLengthDelimited
          (internal *this,uint32_t num,string_view val,string *s)

{
  bool bVar1;
  undefined4 in_register_00000034;
  ulong uVar2;
  char cVar3;
  ulong uVar4;
  
  uVar2 = CONCAT44(in_register_00000034,num);
  uVar4 = (ulong)((int)this * 8 + 2);
  cVar3 = (char)val._M_str;
  if (0x7f < (uint)((int)this << 3)) {
    do {
      std::__cxx11::string::push_back(cVar3);
      bVar1 = 0x3fff < uVar4;
      uVar4 = uVar4 >> 7;
    } while (bVar1);
  }
  std::__cxx11::string::push_back(cVar3);
  if (0x7f < uVar2) {
    do {
      std::__cxx11::string::push_back(cVar3);
      bVar1 = 0x3fff < uVar2;
      uVar2 = uVar2 >> 7;
    } while (bVar1);
  }
  std::__cxx11::string::push_back(cVar3);
  std::__cxx11::string::append(val._M_str,val._M_len);
  return;
}

Assistant:

void WriteLengthDelimited(uint32_t num, absl::string_view val, std::string* s) {
  WriteVarint((num << 3) + 2, s);
  WriteVarint(val.size(), s);
  s->append(val.data(), val.size());
}